

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv__tcp_bind(uv_tcp_t *tcp,sockaddr *addr,uint addrlen,uint flags)

{
  uint uVar1;
  undefined4 in_EAX;
  int iVar2;
  int *piVar3;
  int on;
  undefined8 uStack_28;
  
  if (((flags & 1) != 0) && (addr->sa_family != 10)) {
    return -0x16;
  }
  uStack_28._0_4_ = in_EAX;
  iVar2 = maybe_new_socket(tcp,(uint)addr->sa_family,0);
  if (iVar2 != 0) {
    return iVar2;
  }
  uStack_28 = CONCAT44(1,(undefined4)uStack_28);
  iVar2 = setsockopt((tcp->io_watcher).fd,1,2,(void *)((long)&uStack_28 + 4),4);
  if (iVar2 == 0) {
    if (addr->sa_family == 10) {
      uStack_28 = CONCAT44(flags,(undefined4)uStack_28) & 0x1ffffffff;
      iVar2 = setsockopt((tcp->io_watcher).fd,0x29,0x1a,(void *)((long)&uStack_28 + 4),4);
      if (iVar2 == -1) goto LAB_00505cef;
    }
    piVar3 = __errno_location();
    *piVar3 = 0;
    iVar2 = bind((tcp->io_watcher).fd,(sockaddr *)addr,addrlen);
    if (iVar2 != 0) {
      iVar2 = *piVar3;
      if (iVar2 == 0x61) {
        return -0x16;
      }
      if (iVar2 != 0x62) {
        return -iVar2;
      }
    }
    tcp->delayed_error = -*piVar3;
    uVar1 = tcp->flags;
    tcp->flags = uVar1 | 0x2000;
    if (addr->sa_family == 10) {
      tcp->flags = uVar1 | 0x402000;
    }
    return 0;
  }
LAB_00505cef:
  piVar3 = __errno_location();
  return -*piVar3;
}

Assistant:

int uv__tcp_bind(uv_tcp_t* tcp,
                 const struct sockaddr* addr,
                 unsigned int addrlen,
                 unsigned int flags) {
  int err;
  int on;

  /* Cannot set IPv6-only mode on non-IPv6 socket. */
  if ((flags & UV_TCP_IPV6ONLY) && addr->sa_family != AF_INET6)
    return UV_EINVAL;

  err = maybe_new_socket(tcp, addr->sa_family, 0);
  if (err)
    return err;

  on = 1;
  if (setsockopt(tcp->io_watcher.fd, SOL_SOCKET, SO_REUSEADDR, &on, sizeof(on)))
    return UV__ERR(errno);

#ifndef __OpenBSD__
#ifdef IPV6_V6ONLY
  if (addr->sa_family == AF_INET6) {
    on = (flags & UV_TCP_IPV6ONLY) != 0;
    if (setsockopt(tcp->io_watcher.fd,
                   IPPROTO_IPV6,
                   IPV6_V6ONLY,
                   &on,
                   sizeof on) == -1) {
#if defined(__MVS__)
      if (errno == EOPNOTSUPP)
        return UV_EINVAL;
#endif
      return UV__ERR(errno);
    }
  }
#endif
#endif

  errno = 0;
  if (bind(tcp->io_watcher.fd, addr, addrlen) && errno != EADDRINUSE) {
    if (errno == EAFNOSUPPORT)
      /* OSX, other BSDs and SunoS fail with EAFNOSUPPORT when binding a
       * socket created with AF_INET to an AF_INET6 address or vice versa. */
      return UV_EINVAL;
    return UV__ERR(errno);
  }
  tcp->delayed_error = UV__ERR(errno);

  tcp->flags |= UV_HANDLE_BOUND;
  if (addr->sa_family == AF_INET6)
    tcp->flags |= UV_HANDLE_IPV6;

  return 0;
}